

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_PCM.cpp
# Opt level: O0

h__Writer * __thiscall
ASDCP::PCM::MXFWriter::h__Writer::OpenWrite(h__Writer *this,string *filename,ui32_t HeaderSize)

{
  bool bVar1;
  int iVar2;
  WaveAudioDescriptor *this_00;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  h__WriterState local_a0 [30];
  undefined1 local_25;
  undefined4 local_24;
  undefined8 uStack_20;
  ui32_t HeaderSize_local;
  string *filename_local;
  h__Writer *this_local;
  Result_t *result;
  
  uStack_20 = CONCAT44(in_register_00000014,HeaderSize);
  local_24 = in_ECX;
  filename_local = filename;
  this_local = this;
  bVar1 = MXF::h__WriterState::Test_BEGIN((h__WriterState *)&filename[0x1b].field_2);
  if (bVar1) {
    local_25 = 0;
    Kumu::FileWriter::OpenWrite((string *)this);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      *(undefined4 *)&filename[2]._M_string_length = local_24;
      this_00 = (WaveAudioDescriptor *)operator_new(0x1e8);
      MXF::WaveAudioDescriptor::WaveAudioDescriptor
                (this_00,(Dictionary *)filename->_M_string_length);
      *(WaveAudioDescriptor **)((long)&filename[0x18].field_2 + 8) = this_00;
      MXF::h__WriterState::Goto_INIT(local_a0);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a0);
      Kumu::Result_t::~Result_t((Result_t *)local_a0);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ui32_t HeaderSize)
{
  if ( ! m_State.Test_BEGIN() )
    return RESULT_STATE;

  Result_t result = m_File.OpenWrite(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      m_HeaderSize = HeaderSize;
      m_EssenceDescriptor = new WaveAudioDescriptor(m_Dict);
      result = m_State.Goto_INIT();
    }

  return result;
}